

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_add(REF_NODE ref_node,REF_GLOB global,REF_INT *node)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  undefined8 uVar6;
  long lVar7;
  char *pcVar8;
  
  if (global < 0) {
    pcVar8 = "invalid global node";
    uVar2 = 3;
    uVar6 = 0x150;
  }
  else {
    uVar2 = ref_node_local(ref_node,global,node);
    if (uVar2 == 0) {
      return 0;
    }
    if (uVar2 == 5) {
      uVar2 = ref_node_add_core(ref_node,global,node);
      if (uVar2 == 0) {
        iVar1 = ref_node->n;
        lVar3 = (long)iVar1;
        uVar5 = (ulong)(iVar1 - 1);
        for (uVar2 = iVar1 - 2; lVar4 = lVar3, -1 < (int)uVar2; uVar2 = uVar2 - 1) {
          if (ref_node->sorted_global[uVar2] < global) goto LAB_00196cba;
          uVar5 = uVar5 - 1;
        }
        uVar5 = 0;
LAB_00196cba:
        while (lVar7 = lVar4 + -1, (long)uVar5 < lVar7) {
          ref_node->sorted_global[lVar7] = ref_node->sorted_global[lVar4 + -2];
          lVar4 = lVar7;
        }
        while (lVar4 = lVar3 + -1, (long)uVar5 < lVar4) {
          ref_node->sorted_local[lVar4] = ref_node->sorted_local[lVar3 + -2];
          lVar3 = lVar4;
        }
        ref_node->sorted_global[uVar5] = global;
        ref_node->sorted_local[uVar5] = *node;
        return 0;
      }
      pcVar8 = "core";
      uVar6 = 0x156;
    }
    else {
      pcVar8 = "ref_node_local unexpected status";
      uVar6 = 0x154;
    }
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar6,
         "ref_node_add",(ulong)uVar2,pcVar8);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_node_add(REF_NODE ref_node, REF_GLOB global,
                                REF_INT *node) {
  REF_INT location, insert_point;
  REF_STATUS status;

  if (global < 0) RSS(REF_INVALID, "invalid global node");

  status = ref_node_local(ref_node, global, node);
  if (REF_SUCCESS == status) return REF_SUCCESS;
  RXS(status, REF_NOT_FOUND, "ref_node_local unexpected status");

  RSS(ref_node_add_core(ref_node, global, node), "core");

  /* general case of non-ascending global node, requires:
     search and shift (but looks to see if bigger than last early) */
  insert_point = 0;
  for (location = ref_node_n(ref_node) - 2; location >= 0; location--) {
    if (ref_node->sorted_global[location] < global) {
      insert_point = location + 1;
      break;
    }
  }

  /* shift down to clear insert_point */
  for (location = ref_node_n(ref_node) - 1; location > insert_point; location--)
    ref_node->sorted_global[location] = ref_node->sorted_global[location - 1];
  for (location = ref_node_n(ref_node) - 1; location > insert_point; location--)
    ref_node->sorted_local[location] = ref_node->sorted_local[location - 1];

  /* insert in empty location */
  ref_node->sorted_global[insert_point] = global;
  ref_node->sorted_local[insert_point] = *node;

  return REF_SUCCESS;
}